

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

bool __thiscall Uniforms::addSequence(Uniforms *this,string *_name,string *_filename)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  size_type sVar4;
  mapped_type *this_00;
  undefined1 local_308 [8];
  UniformData data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  undefined1 local_278 [8];
  string line;
  istream local_248 [8];
  ifstream infile;
  undefined1 local_40 [8];
  vector<UniformData,_std::allocator<UniformData>_> uniform_data_sequence;
  string *_filename_local;
  string *_name_local;
  Uniforms *this_local;
  
  uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)_filename;
  std::vector<UniformData,_std::allocator<UniformData>_>::vector
            ((vector<UniformData,_std::allocator<UniformData>_> *)local_40);
  std::ifstream::ifstream
            (local_248,
             (string *)
             uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_278,"",
             (allocator *)
             ((long)&values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_248,(string *)local_278);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    lVar3 = std::__cxx11::string::size();
    if (lVar3 != 0) {
      vera::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&data.bInt,(string *)local_278,',',true);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&data.bInt);
      if (sVar4 != 0) {
        UniformData::UniformData((UniformData *)local_308);
        UniformData::parse((UniformData *)local_308,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&data.bInt,0,false);
        std::vector<UniformData,_std::allocator<UniformData>_>::push_back
                  ((vector<UniformData,_std::allocator<UniformData>_> *)local_40,
                   (value_type *)local_308);
        UniformData::~UniformData((UniformData *)local_308);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data.bInt);
    }
  }
  sVar4 = std::vector<UniformData,_std::allocator<UniformData>_>::size
                    ((vector<UniformData,_std::allocator<UniformData>_> *)local_40);
  if (sVar4 != 0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>_>
              ::operator[](&this->sequences,_name);
    std::vector<UniformData,_std::allocator<UniformData>_>::operator=
              (this_00,(vector<UniformData,_std::allocator<UniformData>_> *)local_40);
  }
  std::__cxx11::string::~string((string *)local_278);
  std::ifstream::~ifstream(local_248);
  std::vector<UniformData,_std::allocator<UniformData>_>::~vector
            ((vector<UniformData,_std::allocator<UniformData>_> *)local_40);
  return sVar4 != 0;
}

Assistant:

bool Uniforms::addSequence( const std::string& _name, const std::string& _filename) {
    std::vector<UniformData> uniform_data_sequence;

    // Open file _filename and read all lines
    std::ifstream infile(_filename);
    std::string line = "";
    while (std::getline(infile, line)) {
        if (line.size() > 0) {
            std::vector<std::string> values = vera::split(line,',', true);
            if (values.size() > 0) {
                UniformData data;
                data.parse(values, 0, false);
                uniform_data_sequence.push_back(data);
            }
        }
    }

    // std::cout << "Load " << _name << " from " << _filename <<  " with " << uniform_data_sequence.size() << " values" << std::endl;
    if (uniform_data_sequence.size() == 0)
        return false;

    sequences[_name] = uniform_data_sequence;

    return true;
}